

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t intersect_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  uVar9 = s_a & 0xfffffffffffffff8;
  uVar10 = s_b & 0xfffffffffffffff8;
  if (uVar10 == 0 || uVar9 == 0) {
    lVar6 = 0;
    uVar5 = 0;
    uVar8 = 0;
  }
  else {
    auVar2 = vlddqu_avx(*(undefined1 (*) [16])A);
    auVar12 = ZEXT1664(auVar2);
    auVar2 = vlddqu_avx(*(undefined1 (*) [16])B);
    auVar13 = ZEXT1664(auVar2);
    uVar7 = 0;
    uVar4 = 0;
    lVar6 = 0;
    while ((uVar8 = uVar7, A[uVar4] == 0 || (B[uVar7] == 0))) {
      vpcmpestrm_avx(auVar13._0_16_,auVar12._0_16_,1);
      iVar11 = in_ZMM0._0_4_;
      auVar2 = vpshufb_avx(auVar12._0_16_,
                           *(undefined1 (*) [16])(shuffle_mask16 + (long)iVar11 * 0x10));
      in_ZMM0 = ZEXT1664(auVar2);
      *(undefined1 (*) [16])(C + lVar6) = auVar2;
      lVar6 = lVar6 + (ulong)(uint)POPCOUNT(iVar11);
      lVar3 = uVar4 + 7;
      if (A[lVar3] <= B[uVar7 + 7]) {
        uVar4 = uVar4 + 8;
        uVar5 = uVar9;
        if (uVar4 == uVar9) goto LAB_00101725;
        auVar2 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar4));
        auVar12 = ZEXT1664(auVar2);
      }
      if (B[uVar7 + 7] <= A[lVar3]) {
        uVar7 = uVar7 + 8;
        uVar5 = uVar4;
        uVar8 = uVar10;
        if (uVar7 == uVar10) goto LAB_00101725;
        auVar2 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar7));
        auVar13 = ZEXT1664(auVar2);
      }
    }
    uVar5 = uVar4;
    if (uVar7 < uVar10 && uVar4 < uVar9) {
      while( true ) {
        uVar1 = B[uVar7 + 7];
        do {
          vpcmpistrm_avx(auVar13._0_16_,auVar12._0_16_,1);
          iVar11 = in_ZMM0._0_4_;
          auVar2 = vpshufb_avx(auVar12._0_16_,
                               *(undefined1 (*) [16])(shuffle_mask16 + (long)iVar11 * 0x10));
          in_ZMM0 = ZEXT1664(auVar2);
          *(undefined1 (*) [16])(C + lVar6) = auVar2;
          lVar6 = (ulong)(uint)POPCOUNT(iVar11) + lVar6;
          lVar3 = uVar4 + 7;
          if (A[lVar3] <= uVar1) {
            uVar4 = uVar4 + 8;
            uVar5 = uVar9;
            uVar8 = uVar7;
            if (uVar4 == uVar9) goto LAB_00101725;
            auVar2 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar4));
            auVar12 = ZEXT1664(auVar2);
          }
        } while (A[lVar3] < uVar1);
        uVar7 = uVar7 + 8;
        uVar5 = uVar4;
        uVar8 = uVar10;
        if (uVar7 == uVar10) break;
        auVar2 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar7));
        auVar13 = ZEXT1664(auVar2);
      }
    }
  }
LAB_00101725:
  if (uVar8 < s_b && uVar5 < s_a) {
    do {
      uVar1 = A[uVar5];
      if (uVar1 < B[uVar8]) {
        uVar5 = uVar5 + 1;
      }
      else {
        if (uVar1 <= B[uVar8]) {
          C[lVar6] = uVar1;
          lVar6 = lVar6 + 1;
          uVar5 = uVar5 + 1;
        }
        uVar8 = uVar8 + 1;
      }
    } while ((uVar5 < s_a) && (uVar8 < s_b));
  }
  return (int32_t)lVar6;
}

Assistant:

CROARING_TARGET_AVX2
int32_t intersect_vector16(const uint16_t *__restrict__ A, size_t s_a,
                           const uint16_t *__restrict__ B, size_t s_b,
                           uint16_t *C) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_load_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_load_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            C[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}